

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O3

uint32_t ixgbe_rx_batch(ixy_device *ixy,uint16_t queue_id,pkt_buf **bufs,uint32_t num_bufs)

{
  _Bool _Var1;
  interrupt_queues *piVar2;
  pkt_buf *ppVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  ulong uVar7;
  pkt_buf *ppVar8;
  uint64_t uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long extraout_RDX;
  ulong uVar13;
  uint uVar14;
  interrupt_queues *interrupt;
  long *plVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  ushort uVar19;
  long lVar20;
  mempool *mempool;
  long lVar21;
  uint uVar22;
  uint *puVar23;
  long *plVar24;
  
  _Var1 = (ixy->interrupts).interrupts_enabled;
  if (_Var1 == false) {
    interrupt = (interrupt_queues *)0x0;
  }
  else {
    piVar2 = (ixy->interrupts).queues;
    interrupt = piVar2 + queue_id;
    if (piVar2[queue_id].interrupt_enabled == true) {
      vfio_epoll_wait(interrupt->vfio_epoll_fd,10,(ixy->interrupts).timeout_ms);
    }
  }
  if (num_bufs == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    plVar15 = (long *)(ixy[1].driver_name + (uint)queue_id * 0x18);
    uVar19 = *(ushort *)((long)plVar15 + 0x12);
    uVar10 = (ulong)uVar19;
    lVar21 = *plVar15;
    uVar17 = (uint)uVar19;
    uVar18 = (ulong)uVar19 * 0x10;
    uVar6 = *(uint *)(lVar21 + 8 + uVar18);
    if ((uVar6 & 1) != 0) {
      lVar20 = (ulong)num_bufs - 1;
      plVar24 = (long *)(lVar21 + uVar18);
      puVar23 = (uint *)(lVar21 + 8 + uVar18);
      lVar21 = 0;
      uVar13 = uVar10;
      mempool = (mempool *)lVar20;
      do {
        uVar7 = uVar10;
        iVar16 = (int)uVar18;
        if ((uVar6 & 2) == 0) {
          ixgbe_rx_batch_cold_2();
LAB_00105d7e:
          ixgbe_rx_batch_cold_1();
          plVar15 = (long *)(*(long *)&mempool[5].buf_size + (ulong)(uint)(iVar16 << 4));
          uVar11 = (ulong)*(ushort *)
                           (*(long *)&mempool[5].buf_size + 10 + (ulong)(uint)(iVar16 << 4));
          goto LAB_00105dc0;
        }
        uVar6 = (uint)*(ushort *)((long)plVar24 + 0xe);
        ppVar3 = (pkt_buf *)plVar15[uVar13 + 3];
        ppVar3->size = (uint)*(ushort *)((long)plVar24 + 0xc);
        mempool = (mempool *)plVar15[1];
        ppVar8 = pkt_buf_alloc(mempool);
        if (ppVar8 == (pkt_buf *)0x0) goto LAB_00105d7e;
        *plVar24 = ppVar8->buf_addr_phy + 0x40;
        puVar23[0] = 0;
        puVar23[1] = 0;
        plVar15[uVar13 + 3] = (long)ppVar8;
        bufs[lVar21] = ppVar3;
        uVar17 = (uint)uVar7;
        uVar6 = (int)plVar15[2] - 1U & uVar17 + 1;
        uVar10 = (ulong)uVar6;
        uVar11 = (ulong)num_bufs;
        if (lVar20 == lVar21) break;
        uVar13 = (ulong)(ushort)uVar6;
        lVar21 = lVar21 + 1;
        uVar11 = (ulong)((uVar6 & 0xffff) << 4);
        puVar23 = (uint *)(*plVar15 + 8 + uVar11);
        plVar24 = (long *)(*plVar15 + uVar11);
        uVar6 = *puVar23;
        uVar18 = uVar7;
        uVar11 = lVar21;
      } while ((uVar6 & 1) != 0);
    }
    if ((short)uVar10 != (short)uVar17) {
      uVar6 = (uint)queue_id * 0x40 + 0xc018;
      if (queue_id < 0x40) {
        uVar6 = (uint)queue_id * 0x40 | 0x1018;
      }
      *(uint *)(ixy[1].pci_addr + uVar6) = uVar17 & 0xffff;
      *(short *)((long)plVar15 + 0x12) = (short)uVar10;
    }
  }
  if (_Var1 != false) {
    auVar5 = vpmovsxbq_avx(ZEXT216(0x101));
    uVar10 = interrupt->instr_counter;
    auVar4 = vpinsrq_avx(auVar5,uVar11 & 0xffffffff,1);
    auVar5._0_8_ = interrupt->instr_counter;
    auVar5._8_8_ = interrupt->rx_pkts;
    auVar5 = vpaddq_avx(auVar4,auVar5);
    interrupt->instr_counter = auVar5._0_8_;
    interrupt->rx_pkts = auVar5._8_8_;
    if ((uVar10 & 0xfff) == 0) {
      _Var1 = interrupt->interrupt_enabled;
      uVar9 = monotonic_time();
      uVar10 = uVar9 - interrupt->last_time_checked;
      if (interrupt->interval < uVar10) {
        check_interrupt(interrupt,uVar10,(uint32_t)uVar11,num_bufs);
      }
      if (_Var1 != interrupt->interrupt_enabled) {
        if (interrupt->interrupt_enabled == false) {
          ixgbe_rx_batch_cold_3();
        }
        else {
          enable_interrupt((ixgbe_device *)ixy,queue_id);
        }
      }
    }
  }
  return (uint32_t)uVar11;
LAB_00105dc0:
  uVar17 = (uint)*(ushort *)((long)plVar15 + 0xc);
  uVar10 = uVar11 & 0xffff;
  uVar22 = (uint)uVar10;
  iVar12 = *(ushort *)((long)plVar15 + 0xc) - uVar22;
  if (iVar12 < 0) {
    iVar12 = iVar12 + (uint)*(ushort *)(plVar15 + 1);
  }
  if (iVar12 < 0x20) goto LAB_00105e3c;
  uVar14 = (uint)*(ushort *)(plVar15 + 1);
  if (uVar22 + 0x1f < uVar14) {
    uVar14 = 0;
  }
  uVar14 = (uVar22 + 0x1f) - uVar14;
  if ((*(uint *)(*plVar15 + 0xc + (long)(int)uVar14 * 0x10) & 1) == 0) goto LAB_00105e3c;
  pkt_buf_free((pkt_buf *)plVar15[uVar10 + 2]);
  while (uVar14 != uVar22) {
    uVar22 = (int)plVar15[1] - 1U & (int)uVar10 + 1U & 0xffff;
    uVar10 = (ulong)uVar22;
    pkt_buf_free((pkt_buf *)plVar15[uVar10 + 2]);
  }
  uVar11 = (ulong)((int)plVar15[1] - 1U & uVar14 + 1);
  goto LAB_00105dc0;
LAB_00105e3c:
  *(ushort *)((long)plVar15 + 10) = (ushort)uVar11;
  if (uVar6 == 0) {
    uVar6 = 0;
  }
  else {
    uVar10 = 0;
    do {
      uVar17 = *(uint *)((long)plVar15 + 0xc);
      uVar19 = (short)(int)plVar15[1] - 1U & (short)uVar17 + 1U;
      if ((ushort)uVar11 == uVar19) {
        uVar6 = (uint)uVar10;
        goto LAB_00105eb8;
      }
      plVar24 = *(long **)(extraout_RDX + uVar10 * 8);
      uVar10 = uVar10 + 1;
      plVar15[(ulong)(uVar17 & 0xffff) + 2] = (long)plVar24;
      uVar18 = (ulong)((uVar17 & 0xffff) << 4);
      lVar21 = *plVar15;
      *(ushort *)((long)plVar15 + 0xc) = uVar19;
      *(long *)(lVar21 + uVar18) = *plVar24 + 0x40;
      *(uint *)(lVar21 + 8 + uVar18) = *(uint *)((long)plVar24 + 0x14) | 0x2b300000;
      *(int *)(lVar21 + 0xc + uVar18) = *(int *)((long)plVar24 + 0x14) << 0xe;
    } while (uVar6 != uVar10);
    uVar17 = (uint)*(ushort *)((long)plVar15 + 0xc);
LAB_00105eb8:
    uVar17 = uVar17 & 0xffff;
  }
  *(uint *)(*(long *)&mempool[4].free_stack_top + 0x6018 + (ulong)(uint)(iVar16 << 6)) = uVar17;
  return uVar6;
}

Assistant:

uint32_t ixgbe_rx_batch(struct ixy_device* ixy, uint16_t queue_id, struct pkt_buf* bufs[], uint32_t num_bufs) {
	struct ixgbe_device* dev = IXY_TO_IXGBE(ixy);

	struct interrupt_queues* interrupt = NULL;
	bool interrupts_enabled = ixy->interrupts.interrupts_enabled;

	if (interrupts_enabled) {
		interrupt = &ixy->interrupts.queues[queue_id];
	}

	if (interrupts_enabled && interrupt->interrupt_enabled) {
		vfio_epoll_wait(interrupt->vfio_epoll_fd, 10, dev->ixy.interrupts.timeout_ms);
	}

	struct ixgbe_rx_queue* queue = ((struct ixgbe_rx_queue*) (dev->rx_queues)) + queue_id;
	uint16_t rx_index = queue->rx_index; // rx index we checked in the last run of this function
	uint16_t last_rx_index = rx_index; // index of the descriptor we checked in the last iteration of the loop
	uint32_t buf_index;
	for (buf_index = 0; buf_index < num_bufs; buf_index++) {
		// rx descriptors are explained in 7.1.5
		volatile union ixgbe_adv_rx_desc* desc_ptr = queue->descriptors + rx_index;
		uint32_t status = desc_ptr->wb.upper.status_error;
		if (status & IXGBE_RXDADV_STAT_DD) {
			if (!(status & IXGBE_RXDADV_STAT_EOP)) {
				error("multi-segment packets are not supported - increase buffer size or decrease MTU");
			}
			// got a packet, read and copy the whole descriptor
			union ixgbe_adv_rx_desc desc = *desc_ptr;
			struct pkt_buf* buf = (struct pkt_buf*) queue->virtual_addresses[rx_index];
			buf->size = desc.wb.upper.length;
			// this would be the place to implement RX offloading by translating the device-specific flags
			// to an independent representation in the buf (similiar to how DPDK works)
			// need a new mbuf for the descriptor
			struct pkt_buf* new_buf = pkt_buf_alloc(queue->mempool);
			if (!new_buf) {
				// we could handle empty mempools more gracefully here, but it would be quite messy...
				// make your mempools large enough
				error("failed to allocate new mbuf for rx, you are either leaking memory or your mempool is too small");
			}
			// reset the descriptor
			desc_ptr->read.pkt_addr = new_buf->buf_addr_phy + offsetof(struct pkt_buf, data);
			desc_ptr->read.hdr_addr = 0; // this resets the flags
			queue->virtual_addresses[rx_index] = new_buf;
			bufs[buf_index] = buf;
			// want to read the next one in the next iteration, but we still need the last/current to update RDT later
			last_rx_index = rx_index;
			rx_index = wrap_ring(rx_index, queue->num_entries);
		} else {
			break;
		}
	}
	if (rx_index != last_rx_index) {
		// tell hardware that we are done
		// this is intentionally off by one, otherwise we'd set RDT=RDH if we are receiving faster than packets are coming in
		// RDT=RDH means queue is full
		set_reg32(dev->addr, IXGBE_RDT(queue_id), last_rx_index);
		queue->rx_index = rx_index;
	}

	if (interrupts_enabled) {
		interrupt->rx_pkts += buf_index;

		if ((interrupt->instr_counter++ & 0xFFF) == 0) {
			bool int_en = interrupt->interrupt_enabled;
			uint64_t diff = monotonic_time() - interrupt->last_time_checked;
			if (diff > interrupt->interval) {
				// every second
				check_interrupt(interrupt, diff, buf_index, num_bufs);
			}

			if (int_en != interrupt->interrupt_enabled) {
				if (interrupt->interrupt_enabled) {
					enable_interrupt(dev, queue_id);
				} else {
					disable_interrupt(dev, queue_id);
				}
			}
		}
	}

	return buf_index; // number of packets stored in bufs; buf_index points to the next index
}